

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::internalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type left;
  bool bVar1;
  Shareability share;
  BasicHeapType BVar2;
  HeapType type;
  HeapType type_00;
  HeapType heapType;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Literal *pLVar3;
  Type local_80;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<wasm::GCData> local_68;
  HeapType local_50;
  __shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> local_48;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  local_50 = wasm::Type::getHeapType(&this->type);
  share = HeapType::getShared(&local_50);
  left.id = (this->type).id;
  BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::ext,share);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar2;
  wasm::Type::Type(&local_80,heapType,Nullable,Inexact);
  bVar1 = wasm::Type::isSubType(left,local_80);
  if (!bVar1) {
    __assert_fail("Type::isSubType(type, Type(HeapTypes::ext.getBasic(share), Nullable)) && \"can only internalize external references\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0xb5b,"Literal wasm::Literal::internalize() const");
  }
  bVar1 = wasm::Type::isNull(&this->type);
  if (bVar1) {
    local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
    pLVar3 = local_38;
    type.id._4_4_ = 0;
    type.id._0_4_ = BVar2;
    Literal(local_38,&local_68,type);
    this_00 = &local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  else {
    bVar1 = HeapType::isMaybeShared
                      (&((this->field_0).gcData.
                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type,
                       i31);
    if (bVar1) {
      local_50 = wasm::Type::getHeapType
                           ((Type *)((long)(((this->field_0).gcData.
                                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->values).super_SmallVector<wasm::Literal,_1UL>.
                                           fixed._M_elems + 0x10));
      bVar1 = HeapType::isMaybeShared(&local_50,i31);
      pLVar3 = local_38;
      if (bVar1) {
        Literal(local_38,(((this->field_0).gcData.
                           super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        return pLVar3;
      }
      __assert_fail("gcData->values[0].type.getHeapType().isMaybeShared(HeapType::i31)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0xb60,"Literal wasm::Literal::internalize() const");
    }
    bVar1 = HeapType::isMaybeShared
                      (&((this->field_0).gcData.
                         super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type,
                       string);
    if (bVar1) {
      std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,(__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this);
      BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::any,share);
      pLVar3 = local_38;
      type_00.id._4_4_ = 0;
      type_00.id._0_4_ = BVar2;
      Literal(local_38,(shared_ptr<wasm::GCData> *)&local_48,type_00);
      this_00 = &local_48._M_refcount;
    }
    else {
      std::__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,(__shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2> *)this);
      pLVar3 = local_38;
      Literal(local_38,(shared_ptr<wasm::GCData> *)&local_78,
              (HeapType)
              (((this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->type).id);
      this_00 = &local_78._M_refcount;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return pLVar3;
}

Assistant:

Literal Literal::internalize() const {
  auto share = type.getHeapType().getShared();
  assert(
    Type::isSubType(type, Type(HeapTypes::ext.getBasic(share), Nullable)) &&
    "can only internalize external references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapTypes::none.getBasic(share));
  }
  if (gcData->type.isMaybeShared(HeapType::i31)) {
    assert(gcData->values[0].type.getHeapType().isMaybeShared(HeapType::i31));
    return gcData->values[0];
  }
  if (gcData->type.isMaybeShared(HeapType::string)) {
    // Strings turn into anyref literals.
    return Literal(gcData, HeapTypes::any.getBasic(share));
  }
  return Literal(gcData, gcData->type);
}